

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton5.cpp
# Opt level: O1

int main(void)

{
  int x;
  undefined4 local_4;
  
  (*(code *)es::init::singleton<Data<0U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  (*(code *)es::init::singleton<Data<0U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  (*(code *)es::init::singleton<Data<2U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  (*(code *)es::init::singleton<Data<3U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  local_4 = 0;
  do {
    (*(code *)es::init::singleton<Data<0U>,_es::init::early_initializer,_void,_std::ios_base::Init>
              ::_get_instance._M_b._M_p)();
    local_4 = local_4 + 1;
  } while (local_4 < 1000);
  return 0;
}

Assistant:

int main()
{
    test1();
    test2();
    test3();

    return 0;
}